

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::utia::utia(utia *this,char *filename)

{
  char cVar1;
  exc *peVar2;
  fstream f;
  byte abStack_208 [496];
  
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001f5f00;
  (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(&f,filename,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    peVar2 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(peVar2,"djb_error: Failed to open %s\n",filename);
    __cxa_throw(peVar2,&exc::typeinfo,exc::~exc);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_samples,0x3cc00);
  std::istream::read((char *)&f,
                     (long)(this->m_samples).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  this->m_norm = 1.0;
  normalize(this);
  if ((abStack_208[*(long *)(_f + -0x18)] & 5) == 0) {
    std::fstream::~fstream(&f);
    return;
  }
  peVar2 = (exc *)__cxa_allocate_exception(0x28);
  exc::exc(peVar2,"djb_error: Reading %s failed\n",filename);
  __cxa_throw(peVar2,&exc::typeinfo,exc::~exc);
}

Assistant:

utia::utia(const char *filename)
{
	// open file
	std::fstream f(filename, std::fstream::in | std::fstream::binary);
	if (!f.is_open())
		throw exc("djb_error: Failed to open %s\n", filename);

	// allocate memory
	int cnt = DJB__UTIA_PLANES * DJB__UTIA_NTI * DJB__UTIA_NPI
	        * DJB__UTIA_NTV * DJB__UTIA_NPV;
	m_samples.resize(cnt);

	// read data
	f.read((char *)&m_samples[0], sizeof(double) * cnt);

	// normalize
	m_norm = 1.0;
	normalize();
	if (f.fail())
		throw exc("djb_error: Reading %s failed\n", filename);
}